

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::SelectFlatLoopSwitch<int,int,duckdb::GreaterThan,false,false>
                (int *ldata,int *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  sel_t sVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  unsigned_long uVar16;
  ulong uVar17;
  
  uVar1 = count + 0x3f;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar1 < 0x40) {
        lVar11 = 0;
      }
      else {
        puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar11 = 0;
        uVar13 = 0;
        uVar17 = 0;
        do {
          if (puVar4 == (unsigned_long *)0x0) {
            uVar16 = 0xffffffffffffffff;
          }
          else {
            uVar16 = puVar4[uVar13];
          }
          uVar10 = uVar17 + 0x40;
          if (count <= uVar17 + 0x40) {
            uVar10 = count;
          }
          uVar14 = uVar17;
          if (uVar16 == 0xffffffffffffffff) {
            if (uVar17 < uVar10) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              do {
                uVar14 = uVar17;
                if (psVar5 != (sel_t *)0x0) {
                  uVar14 = (ulong)psVar5[uVar17];
                }
                iVar3 = ldata[uVar17];
                iVar2 = rdata[uVar17];
                psVar6[lVar11] = (sel_t)uVar14;
                lVar11 = lVar11 + (ulong)(iVar3 <= iVar2);
                uVar17 = uVar17 + 1;
                uVar14 = uVar17;
              } while (uVar10 != uVar17);
            }
          }
          else if (uVar16 == 0) {
            uVar14 = uVar10;
            if (uVar17 < uVar10) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              do {
                sVar9 = (sel_t)uVar17;
                if (psVar5 != (sel_t *)0x0) {
                  sVar9 = psVar5[uVar17];
                }
                psVar6[lVar11] = sVar9;
                lVar11 = lVar11 + 1;
                uVar17 = uVar17 + 1;
              } while (uVar10 != uVar17);
            }
          }
          else if (uVar17 < uVar10) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            uVar14 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar9 = (int)uVar17 + (int)uVar14;
              }
              else {
                sVar9 = psVar5[uVar17 + uVar14];
              }
              if ((uVar16 >> (uVar14 & 0x3f) & 1) == 0) {
                uVar15 = 1;
              }
              else {
                uVar15 = (ulong)(ldata[uVar17 + uVar14] <= rdata[uVar17 + uVar14]);
              }
              psVar6[lVar11] = sVar9;
              lVar11 = lVar11 + uVar15;
              uVar14 = uVar14 + 1;
            } while ((uVar17 - uVar10) + uVar14 != 0);
            uVar14 = uVar17 + uVar14;
          }
          uVar13 = uVar13 + 1;
          uVar17 = uVar14;
        } while (uVar13 != uVar1 >> 6);
      }
      return count - lVar11;
    }
    if (0x3f < uVar1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      uVar13 = 0;
      uVar17 = 0;
      do {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar16 = 0xffffffffffffffff;
        }
        else {
          uVar16 = puVar4[uVar13];
        }
        uVar10 = uVar17 + 0x40;
        if (count <= uVar17 + 0x40) {
          uVar10 = count;
        }
        uVar14 = uVar10;
        if (uVar16 != 0) {
          uVar14 = uVar17;
          if (uVar16 == 0xffffffffffffffff) {
            if (uVar17 < uVar10) {
              psVar5 = sel->sel_vector;
              psVar6 = true_sel->sel_vector;
              do {
                uVar17 = uVar14;
                if (psVar5 != (sel_t *)0x0) {
                  uVar17 = (ulong)psVar5[uVar14];
                }
                iVar3 = ldata[uVar14];
                iVar2 = rdata[uVar14];
                psVar6[iVar8] = (sel_t)uVar17;
                iVar8 = iVar8 + (iVar2 < iVar3);
                uVar14 = uVar14 + 1;
              } while (uVar10 != uVar14);
            }
          }
          else if (uVar17 < uVar10) {
            psVar5 = sel->sel_vector;
            psVar6 = true_sel->sel_vector;
            uVar14 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar9 = (int)uVar17 + (int)uVar14;
              }
              else {
                sVar9 = psVar5[uVar17 + uVar14];
              }
              if ((uVar16 >> (uVar14 & 0x3f) & 1) == 0) {
                uVar15 = 0;
              }
              else {
                uVar15 = (ulong)(rdata[uVar17 + uVar14] < ldata[uVar17 + uVar14]);
              }
              psVar6[iVar8] = sVar9;
              iVar8 = iVar8 + uVar15;
              uVar14 = uVar14 + 1;
            } while ((uVar17 - uVar10) + uVar14 != 0);
            uVar14 = uVar17 + uVar14;
          }
        }
        uVar13 = uVar13 + 1;
        uVar17 = uVar14;
      } while (uVar13 != uVar1 >> 6);
      return iVar8;
    }
  }
  else if (0x3f < uVar1) {
    puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar8 = 0;
    lVar11 = 0;
    uVar13 = 0;
    uVar17 = 0;
    do {
      if (puVar4 == (unsigned_long *)0x0) {
        uVar16 = 0xffffffffffffffff;
      }
      else {
        uVar16 = puVar4[uVar13];
      }
      uVar10 = uVar17 + 0x40;
      if (count <= uVar17 + 0x40) {
        uVar10 = count;
      }
      uVar14 = uVar17;
      if (uVar16 == 0xffffffffffffffff) {
        if (uVar17 < uVar10) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          do {
            uVar14 = uVar17;
            if (psVar5 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar5[uVar17];
            }
            iVar3 = ldata[uVar17];
            iVar2 = rdata[uVar17];
            psVar6[iVar8] = (sel_t)uVar14;
            iVar8 = iVar8 + (iVar2 < iVar3);
            psVar7[lVar11] = (sel_t)uVar14;
            lVar11 = lVar11 + (ulong)(iVar3 <= iVar2);
            uVar17 = uVar17 + 1;
            uVar14 = uVar17;
          } while (uVar10 != uVar17);
        }
      }
      else if (uVar16 == 0) {
        uVar14 = uVar10;
        if (uVar17 < uVar10) {
          psVar5 = sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          do {
            uVar15 = uVar17;
            if (psVar5 != (sel_t *)0x0) {
              uVar15 = (ulong)psVar5[uVar17];
            }
            psVar6[lVar11] = (sel_t)uVar15;
            lVar11 = lVar11 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar10 != uVar17);
        }
      }
      else if (uVar17 < uVar10) {
        psVar5 = sel->sel_vector;
        psVar6 = true_sel->sel_vector;
        psVar7 = false_sel->sel_vector;
        uVar14 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            sVar9 = (int)uVar17 + (int)uVar14;
          }
          else {
            sVar9 = psVar5[uVar17 + uVar14];
          }
          if ((uVar16 >> (uVar14 & 0x3f) & 1) == 0) {
            bVar12 = false;
          }
          else {
            bVar12 = rdata[uVar17 + uVar14] < ldata[uVar17 + uVar14];
          }
          psVar6[iVar8] = sVar9;
          iVar8 = iVar8 + bVar12;
          psVar7[lVar11] = sVar9;
          lVar11 = lVar11 + (ulong)(bVar12 ^ 1);
          uVar14 = uVar14 + 1;
        } while ((uVar17 - uVar10) + uVar14 != 0);
        uVar14 = uVar17 + uVar14;
      }
      uVar13 = uVar13 + 1;
      uVar17 = uVar14;
    } while (uVar13 != uVar1 >> 6);
    return iVar8;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}